

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmExhaustiveRgb.cpp
# Opt level: O0

void __thiscall AlgorithmExhaustiveRgb::Iterate(AlgorithmExhaustiveRgb *this)

{
  int iVar1;
  QRgb a_00;
  QRgb a_01;
  QRgb QVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int bSwappedDifference;
  int aSwappedDifference;
  int bDifference;
  int aDifference;
  QRgb b;
  QRgb a;
  QPoint bLoc;
  QPoint aLoc;
  int local_44;
  anon_class_8_1_8991fb9c aStack_40;
  int repeat;
  undefined1 local_38 [8];
  OnExit exigGuard;
  int repeats;
  AlgorithmExhaustiveRgb *this_local;
  
  exigGuard.onExit._M_invoker._4_4_ = 100000;
  aStack_40.this = this;
  std::function<void()>::function<AlgorithmExhaustiveRgb::Iterate()::__0,void>
            ((function<void()> *)local_38,&stack0xffffffffffffffc0);
  local_44 = 0;
  do {
    iVar3 = this->outerX;
    iVar1 = QImage::width();
    if (iVar1 <= iVar3) {
      this->outerX = 0;
LAB_0010f5d8:
      Iterate::OnExit::~OnExit((OnExit *)local_38);
      return;
    }
    while (iVar3 = this->outerY, iVar1 = QImage::height(), iVar3 < iVar1) {
      while (iVar3 = this->innerX, iVar1 = QImage::width(), iVar3 < iVar1) {
        while (iVar3 = this->innerY, iVar1 = QImage::height(), iVar3 < iVar1) {
          QPoint::QPoint(&bLoc,this->outerX,this->outerY);
          QPoint::QPoint((QPoint *)&b,this->innerX,this->innerY);
          a_00 = QImage::pixel(&(this->super_AlgorithmBase).allRgb_,&bLoc);
          a_01 = QImage::pixel(&(this->super_AlgorithmBase).allRgb_,(QPoint *)&b);
          QVar2 = QImage::pixel(&(this->super_AlgorithmBase).target_,&bLoc);
          iVar3 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_00,QVar2);
          QVar2 = QImage::pixel(&(this->super_AlgorithmBase).target_,(QPoint *)&b);
          iVar1 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_01,QVar2);
          QVar2 = QImage::pixel(&(this->super_AlgorithmBase).target_,(QPoint *)&b);
          iVar4 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_00,QVar2);
          QVar2 = QImage::pixel(&(this->super_AlgorithmBase).target_,&bLoc);
          iVar5 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_01,QVar2);
          if (iVar4 + iVar5 < iVar3 + iVar1) {
            QImage::setPixel(&(this->super_AlgorithmBase).allRgb_,&bLoc,a_01);
            QImage::setPixel(&(this->super_AlgorithmBase).allRgb_,(QPoint *)&b,a_00);
            (this->super_AlgorithmBase).improvements_ =
                 (this->super_AlgorithmBase).improvements_ + 1;
            goto LAB_0010f595;
          }
          local_44 = local_44 + 1;
          if (100000 < local_44) goto LAB_0010f5d8;
          this->innerY = this->innerY + 1;
        }
        this->innerY = 0;
        this->innerX = this->innerX + 1;
      }
      this->innerX = 0;
LAB_0010f595:
      this->outerY = this->outerY + 1;
    }
    this->outerY = 0;
    this->outerX = this->outerX + 1;
  } while( true );
}

Assistant:

void AlgorithmExhaustiveRgb::Iterate()
{
    struct OnExit {
        std::function<void()> onExit;
        ~OnExit()
        {
            onExit();
        }
    };

    // Do a block of repeats in one go for efficiency
    const int repeats = 100000;

    auto exigGuard = OnExit{[&]()
    {
        iterations_ += repeats;

        emit onIterationsChanged(iterations_);
        emit onImprovementsChanged(improvements_);
    }};

    int repeat = 0;

    for (; outerX < allRgb_.width(); ++outerX) {
        for (; outerY < allRgb_.height(); ++outerY) {
            for (; innerX < allRgb_.width(); ++innerX) {
                for (; innerY < allRgb_.height(); ++innerY) {
                    QPoint aLoc{ outerX, outerY };
                    QPoint bLoc{ innerX, innerY };
                    QRgb a = allRgb_.pixel(aLoc);
                    QRgb b = allRgb_.pixel(bLoc);

                    int aDifference = ColourDifference(a, target_.pixel(aLoc));
                    int bDifference = ColourDifference(b, target_.pixel(bLoc));

                    int aSwappedDifference = ColourDifference(a, target_.pixel(bLoc));
                    int bSwappedDifference = ColourDifference(b, target_.pixel(aLoc));

                    if ((aDifference + bDifference) > (aSwappedDifference + bSwappedDifference)) {
                        allRgb_.setPixel(aLoc, b);
                        allRgb_.setPixel(bLoc, a);
                        ++improvements_;
                        goto next;
                    }

                    if (++repeat > repeats) {
                        return;
                    }
                }
                innerY = 0;
            }
            innerX = 0;
next:;
        }
        outerY = 0;
    }
    outerX = 0;
}